

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::UnarySelectPropertyExprSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,UnarySelectPropertyExprSyntax *this,
          size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  SyntaxNode *node;
  size_t index_local;
  UnarySelectPropertyExprSyntax *this_local;
  
  switch(index) {
  case 0:
    token.kind = (this->op).kind;
    token._2_1_ = (this->op).field_0x2;
    token.numFlags.raw = (this->op).numFlags.raw;
    token.rawLen = (this->op).rawLen;
    token.info = (this->op).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 1:
    token_00.kind = (this->openBracket).kind;
    token_00._2_1_ = (this->openBracket).field_0x2;
    token_00.numFlags.raw = (this->openBracket).numFlags.raw;
    token_00.rawLen = (this->openBracket).rawLen;
    token_00.info = (this->openBracket).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 2:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,&this->selector->super_SyntaxNode)
    ;
    break;
  case 3:
    token_01.kind = (this->closeBracket).kind;
    token_01._2_1_ = (this->closeBracket).field_0x2;
    token_01.numFlags.raw = (this->closeBracket).numFlags.raw;
    token_01.rawLen = (this->closeBracket).rawLen;
    token_01.info = (this->closeBracket).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  case 4:
    node = &not_null<slang::syntax::PropertyExprSyntax_*>::get(&this->expr)->super_SyntaxNode;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,node);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax UnarySelectPropertyExprSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return op;
        case 1: return openBracket;
        case 2: return selector;
        case 3: return closeBracket;
        case 4: return expr.get();
        default: return nullptr;
    }
}